

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryScatter<duckdb::CovarState,double,double,duckdb::CovarPopOperation>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,Vector *states,idx_t count)

{
  UnifiedVectorFormat sdata;
  CovarState **local_f8;
  UnifiedVectorFormat bdata;
  double *local_b0;
  ValidityMask local_a8;
  UnifiedVectorFormat adata;
  double *local_68;
  ValidityMask local_60;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  BinaryScatterLoop<duckdb::CovarState,double,double,duckdb::CovarPopOperation>
            (local_68,aggr_input_data,local_b0,local_f8,count,_adata,_bdata,_sdata,&local_60,
             &local_a8);
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  return;
}

Assistant:

static void BinaryScatter(AggregateInputData &aggr_input_data, Vector &a, Vector &b, Vector &states, idx_t count) {
		UnifiedVectorFormat adata, bdata, sdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);
		states.ToUnifiedFormat(count, sdata);

		BinaryScatterLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE **)sdata.data, count, *adata.sel, *bdata.sel, *sdata.sel, adata.validity, bdata.validity);
	}